

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

uint RDL_edgeId(RDL_graph *gra,uint from,uint to)

{
  uint local_1c;
  uint edge;
  uint j;
  uint to_local;
  uint from_local;
  RDL_graph *gra_local;
  
  edge = to;
  j = from;
  if (to < from) {
    edge = from;
    j = to;
  }
  local_1c = 0;
  while( true ) {
    if (gra->degree[j] <= local_1c) {
      return 0xffffffff;
    }
    if (gra->adjList[j][local_1c][0] == edge) break;
    local_1c = local_1c + 1;
  }
  return gra->adjList[j][local_1c][1];
}

Assistant:

unsigned RDL_edgeId(const RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned j, edge;

  if(from > to) {
    /*swap order to make from < to*/
    edge = to;
    to = from;
    from = edge;
  }

  edge = RDL_INVALID_RESULT;

  for(j=0; j<gra->degree[from]; ++j) {
    if(gra->adjList[from][j][0] == to) {
      edge = gra->adjList[from][j][1];
      break;
    }
  }

  return edge;
}